

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlcrc.c
# Opt level: O3

void EBML_CRCAddBuffer(ebml_crc *CRC,void *Buf,size_t Size)

{
  uint uVar1;
  size_t sVar2;
  
  if (3 < Size) {
    uVar1 = CRC->CRC;
    do {
      uVar1 = (uVar1 ^ *Buf) >> 8 ^ m_tab[(uVar1 ^ *Buf) & 0xff];
      uVar1 = uVar1 >> 8 ^ m_tab[uVar1 & 0xff];
      uVar1 = uVar1 >> 8 ^ m_tab[uVar1 & 0xff];
      uVar1 = uVar1 >> 8 ^ m_tab[uVar1 & 0xff];
      CRC->CRC = uVar1;
      Size = Size - 4;
      Buf = (void *)((long)Buf + 4);
    } while (3 < Size);
  }
  if (Size != 0) {
    uVar1 = CRC->CRC;
    sVar2 = 0;
    do {
      uVar1 = uVar1 >> 8 ^ m_tab[(uint)*(byte *)((long)Buf + sVar2) ^ uVar1 & 0xff];
      CRC->CRC = uVar1;
      sVar2 = sVar2 + 1;
    } while (Size != sVar2);
  }
  return;
}

Assistant:

void EBML_CRCAddBuffer(ebml_crc *CRC, const void *Buf, size_t Size)
{
	const uint32_t *Buf32 = Buf;
	while (Size >= 4)
	{
		CRC->CRC ^= *Buf32;
		CRC->CRC = m_tab[CRC32_INDEX(CRC->CRC)] ^ CRC32_SHIFTED(CRC->CRC);
		CRC->CRC = m_tab[CRC32_INDEX(CRC->CRC)] ^ CRC32_SHIFTED(CRC->CRC);
		CRC->CRC = m_tab[CRC32_INDEX(CRC->CRC)] ^ CRC32_SHIFTED(CRC->CRC);
		CRC->CRC = m_tab[CRC32_INDEX(CRC->CRC)] ^ CRC32_SHIFTED(CRC->CRC);
		Size -= 4;
		Buf32++;
	}

	const uint8_t *Buf8 = (const uint8_t *)Buf32;
	while (Size--)
		CRC->CRC = m_tab[CRC32_INDEX(CRC->CRC) ^ *Buf8++] ^ CRC32_SHIFTED(CRC->CRC);
}